

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard.cpp
# Opt level: O0

void __thiscall gepard::Gepard::~Gepard(Gepard *this)

{
  GepardEngine *this_00;
  Gepard *this_local;
  
  if ((this->_engine != (GepardEngine *)0x0) &&
     (this_00 = this->_engine, this_00 != (GepardEngine *)0x0)) {
    GepardEngine::~GepardEngine(this_00);
    operator_delete(this_00);
  }
  Attribute::~Attribute(&this->strokeStyle);
  Attribute::~Attribute(&this->fillStyle);
  Attribute::~Attribute(&this->miterLimit);
  Attribute::~Attribute(&this->lineJoin);
  Attribute::~Attribute(&this->lineCap);
  Attribute::~Attribute(&this->lineWidth);
  return;
}

Assistant:

Gepard::~Gepard()
{
    if (_engine) {
        delete _engine;
    }
}